

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ProfiledNewScIntArray
              (AuxArray<int> *ints,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *pJVar3;
  FunctionBody *functionBody;
  code *pcVar4;
  bool bVar5;
  uint i;
  uint length;
  undefined4 *puVar6;
  JavascriptNativeArray *this;
  ulong uVar7;
  uint i_1;
  ulong srcCount;
  SparseArraySegmentBase *pSVar8;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  length = ints->count;
  srcCount = (ulong)length;
  bVar5 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar5) {
    pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    functionBody = (FunctionBody *)(weakFuncRef->super_RecyclerWeakReferenceBase).strongRef;
    bVar5 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(pJVar3,arrayInfo,length);
    if (bVar5) {
      if ((pJVar3->cacheForCopyOnAccessArraySegments).ptr ==
          (CacheForCopyOnAccessArraySegments *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3ee,"(lib->cacheForCopyOnAccessArraySegments)",
                                    "lib->cacheForCopyOnAccessArraySegments");
        if (!bVar5) {
LAB_00a40eea:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      this = &JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,arrayInfo,
                         functionBody,ints)->super_JavascriptNativeArray;
    }
    else {
      this = &JavascriptLibrary::CreateNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,length)->
              super_JavascriptNativeArray;
      pSVar8 = (((JavascriptNativeArray *)&this->super_JavascriptArray)->super_JavascriptArray).head
               .ptr;
      if ((length == 0) || (length != pSVar8->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x3f6,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) goto LAB_00a40eea;
        *puVar6 = 0;
        length = pSVar8->length;
      }
      Memory::CopyArray<int,int,Memory::Recycler>
                ((int *)(pSVar8 + 1),(ulong)length,(int *)(ints + 1),srcCount);
    }
    JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
  }
  else {
    bVar5 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if (bVar5) {
      this = &JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar3,length)->
              super_JavascriptNativeArray;
      pSVar8 = (this->super_JavascriptArray).head.ptr;
      if ((length == 0) || (length != pSVar8->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x403,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) goto LAB_00a40eea;
        *puVar6 = 0;
      }
      for (uVar7 = 0; srcCount != uVar7; uVar7 = uVar7 + 1) {
        *(double *)(&pSVar8[1].left + uVar7 * 2) = (double)(int)ints[uVar7 + 1].count;
      }
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
    }
    else {
      this = (JavascriptNativeArray *)JavascriptLibrary::CreateArrayLiteral(pJVar3,length);
      pSVar8 = (this->super_JavascriptArray).head.ptr;
      if ((length == 0) || (length != pSVar8->length)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x40f,"(count > 0 && count == head->length)",
                                    "count > 0 && count == head->length");
        if (!bVar5) goto LAB_00a40eea;
        *puVar6 = 0;
      }
      pSVar8 = pSVar8 + 1;
      for (uVar7 = 0; srcCount != uVar7; uVar7 = uVar7 + 1) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)pSVar8,
                   (void *)((ulong)ints[uVar7 + 1].count | 0x1000000000000));
        pSVar8 = (SparseArraySegmentBase *)&pSVar8->size;
      }
    }
  }
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewScIntArray(AuxArray<int32> *ints, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScIntArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        uint32 count = ints->count;

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr;

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();
            FunctionBody *functionBody = weakFuncRef->Get();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(count);
                SparseArraySegment<int32> *head = SparseArraySegment<int32>::From(arr->head);
                Assert(count > 0 && count == head->length);
                CopyArray(head->elements, head->length, ints->elements, count);
            }

            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            for (uint i = 0; i < count; i++)
            {
                head->elements[i] = (double)ints->elements[i];
            }
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            head->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScIntArray);
    }